

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_node_free(lys_node *node,_func_void_lys_node_ptr_void_ptr *private_destructor,int shallow)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  lys_node *plVar2;
  char *pcVar3;
  lys_ext_instance **pplVar4;
  lys_when *w;
  lys_module *value;
  lys_node *node_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (node == (lys_node *)0x0) {
    return;
  }
  if (node->module == (lys_module *)0x0) {
    __assert_fail("node->module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xad0,
                  "void lys_node_free(struct lys_node *, void (*)(const struct lys_node *, void *), int)"
                 );
  }
  ctx = node->module->ctx;
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("node->module->ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xad1,
                  "void lys_node_free(struct lys_node *, void (*)(const struct lys_node *, void *), int)"
                 );
  }
  if (private_destructor != (_func_void_lys_node_ptr_void_ptr *)0x0 && node->priv != (void *)0x0) {
    (*private_destructor)(node,node->priv);
  }
  lydict_remove(ctx,node->name);
  if ((node->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
    lys_iffeature_free(ctx,node->iffeature,node->iffeature_size,shallow,private_destructor);
    lydict_remove(ctx,node->dsc);
    lydict_remove(ctx,node->ref);
  }
  if ((shallow == 0) && ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    node_00 = node->child;
    while (node_00 != (lys_node *)0x0) {
      plVar2 = node_00->next;
      lys_node_free(node_00,private_destructor,0);
      node_00 = plVar2;
    }
  }
  lys_extension_instances_free(ctx,node->ext,(uint)node->ext_size,private_destructor);
  LVar1 = node->nodetype;
  if (0x7f < (int)LVar1) {
    if ((int)LVar1 < 0x800) {
      if ((int)LVar1 < 0x200) {
        if (LVar1 != LYS_NOTIF) {
          if (LVar1 != LYS_RPC) goto switchD_0015e03e_caseD_3;
          goto LAB_0015e08b;
        }
        if (node->padding[1] != '\0') {
          lVar8 = 0;
          uVar6 = 0;
          do {
            lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar8),private_destructor);
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x38;
          } while (uVar6 < node->padding[1]);
        }
        free(node[1].dsc);
        if (*(short *)(node->padding + 2) != 0) {
          lVar8 = 0;
          uVar6 = 0;
          do {
            lys_tpdf_free(ctx,(lys_tpdf *)(node[1].name + lVar8),private_destructor);
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x80;
          } while (uVar6 < *(ushort *)(node->padding + 2));
        }
      }
      else {
        if ((LVar1 != LYS_INPUT) && (LVar1 != LYS_OUTPUT)) goto switchD_0015e03e_caseD_3;
        if (*(short *)(node->padding + 2) != 0) {
          lVar8 = 0;
          uVar6 = 0;
          do {
            lys_tpdf_free(ctx,(lys_tpdf *)(*(long *)node->hash + lVar8),private_destructor);
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x80;
          } while (uVar6 < *(ushort *)(node->padding + 2));
        }
        free(*(void **)node->hash);
        if (node->padding[1] != '\0') {
          lVar8 = 0;
          uVar6 = 0;
          do {
            lys_restr_free(ctx,(lys_restr *)(node[1].name + lVar8),private_destructor);
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x38;
          } while (uVar6 < node->padding[1]);
        }
      }
LAB_0015e59b:
      pcVar3 = node[1].name;
    }
    else {
      if (0x3fff < (int)LVar1) {
        if (LVar1 != LYS_ACTION) {
          if (LVar1 == LYS_ANYDATA) goto LAB_0015e344;
          if (LVar1 != LYS_EXT) goto switchD_0015e03e_caseD_3;
          goto switchD_0015e03e_caseD_0;
        }
LAB_0015e08b:
        if (*(short *)(node->padding + 2) != 0) {
          lVar8 = 0;
          uVar6 = 0;
          do {
            lys_tpdf_free(ctx,(lys_tpdf *)(node[1].name + lVar8),private_destructor);
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x80;
          } while (uVar6 < *(ushort *)(node->padding + 2));
        }
        goto LAB_0015e59b;
      }
      if (LVar1 != LYS_GROUPING) {
        if (LVar1 != LYS_USES) goto switchD_0015e03e_caseD_3;
        if (node->padding[2] != '\0') {
          uVar6 = 0;
          do {
            lVar8 = uVar6 * 0x50;
            lydict_remove(ctx,*(char **)(node[1].name + lVar8));
            lydict_remove(ctx,*(char **)(node[1].name + lVar8 + 8));
            lydict_remove(ctx,*(char **)(node[1].name + lVar8 + 0x10));
            lys_iffeature_free(ctx,*(lys_iffeature **)(node[1].name + lVar8 + 0x28),
                               node[1].name[lVar8 + 0x1b],0,private_destructor);
            pcVar3 = node[1].name;
            if (pcVar3[lVar8 + 0x1e] != '\0') {
              lVar5 = 0;
              uVar7 = 0;
              do {
                lys_restr_free(ctx,(lys_restr *)(*(long *)(pcVar3 + lVar8 + 0x38) + lVar5),
                               private_destructor);
                uVar7 = uVar7 + 1;
                pcVar3 = node[1].name;
                lVar5 = lVar5 + 0x38;
              } while (uVar7 < (byte)pcVar3[lVar8 + 0x1e]);
            }
            free(*(void **)(pcVar3 + lVar8 + 0x38));
            pcVar3 = node[1].name;
            if (pcVar3[lVar8 + 0x1f] != '\0') {
              uVar7 = 0;
              do {
                lydict_remove(ctx,*(char **)(*(long *)(pcVar3 + lVar8 + 0x40) + uVar7 * 8));
                uVar7 = uVar7 + 1;
                pcVar3 = node[1].name;
              } while (uVar7 < (byte)pcVar3[lVar8 + 0x1f]);
            }
            free(*(void **)(pcVar3 + lVar8 + 0x40));
            lys_extension_instances_free
                      (ctx,*(lys_ext_instance ***)(node[1].name + lVar8 + 0x20),
                       (uint)(byte)node[1].name[lVar8 + 0x1a],private_destructor);
            if ((node[1].name[lVar8 + 0x1c] & 1U) != 0) {
              lydict_remove(ctx,*(char **)(node[1].name + lVar8 + 0x48));
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < node->padding[2]);
        }
        free(node[1].name);
        if (node->padding[3] != '\0') {
          lVar8 = 0;
          uVar6 = 0;
          do {
            lys_augment_free(ctx,(lys_node_augment *)(node[1].dsc + lVar8),private_destructor);
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x68;
          } while (uVar6 < node->padding[3]);
        }
        free(node[1].dsc);
        goto switchD_0015e03e_caseD_2;
      }
      if (*(short *)(node->padding + 2) != 0) {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_tpdf_free(ctx,(lys_tpdf *)(*(long *)node->hash + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x80;
        } while (uVar6 < *(ushort *)(node->padding + 2));
      }
      pcVar3 = *(char **)node->hash;
    }
    free(pcVar3);
    goto switchD_0015e03e_caseD_3;
  }
  if ((int)LVar1 < 0x10) {
    switch(LVar1) {
    case LYS_UNKNOWN:
switchD_0015e03e_caseD_0:
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
             ,0xb18);
      goto switchD_0015e03e_caseD_3;
    case LYS_CONTAINER:
      lydict_remove(ctx,*(char **)&node[1].flags);
      if (*(short *)(node->padding + 2) != 0) {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_tpdf_free(ctx,(lys_tpdf *)(node[1].ref + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x80;
        } while (uVar6 < *(ushort *)(node->padding + 2));
      }
      free(node[1].ref);
      if (node->padding[1] != '\0') {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x38;
        } while (uVar6 < node->padding[1]);
      }
LAB_0015e518:
      free(node[1].dsc);
      w = (lys_when *)node[1].name;
      goto LAB_0015e525;
    case LYS_CHOICE:
      goto switchD_0015e03e_caseD_2;
    default:
      goto switchD_0015e03e_caseD_3;
    case LYS_LEAF:
      ly_set_free((ly_set *)node->child);
      if (node->padding[3] != '\0') {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x38;
        } while (uVar6 < node->padding[3]);
      }
      free(node[1].dsc);
      lys_when_free(ctx,(lys_when *)node[1].name,private_destructor);
      lys_type_free(ctx,(lys_type *)&node[1].ref,private_destructor);
      lydict_remove(ctx,(char *)node[1].next);
      value = (lys_module *)node[1].prev;
      break;
    case LYS_LEAFLIST:
      if (node->child != (lys_node *)0x0) {
        ly_set_free((ly_set *)node->child);
      }
      if (node->padding[3] != '\0') {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x38;
        } while (uVar6 < node->padding[3]);
      }
      free(node[1].dsc);
      if (node->padding[2] != '\0') {
        uVar6 = 0;
        do {
          lydict_remove(ctx,*(char **)((node[1].prev)->padding + uVar6 * 8 + -0x1c));
          uVar6 = uVar6 + 1;
        } while (uVar6 < node->padding[2]);
      }
      free(node[1].prev);
      lys_when_free(ctx,(lys_when *)node[1].name,private_destructor);
      lys_type_free(ctx,(lys_type *)&node[1].ref,private_destructor);
      value = (lys_module *)node[1].next;
    }
LAB_0015e6e1:
    lydict_remove(ctx,(char *)value);
  }
  else {
    if (LVar1 == LYS_LIST) {
      lys_when_free(ctx,(lys_when *)node[1].name,private_destructor);
      if (node->padding[0] != '\0') {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x38;
        } while (uVar6 < node->padding[0]);
      }
      free(node[1].dsc);
      if (node->padding[1] != '\0') {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_tpdf_free(ctx,(lys_tpdf *)(node[1].ref + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x80;
        } while (uVar6 < node->padding[1]);
      }
      free(node[1].ref);
      free(*(void **)&node[1].flags);
      if (node->padding[3] != '\0') {
        uVar6 = 0;
        do {
          pplVar4 = node[1].ext + uVar6 * 2;
          if (*(char *)(node[1].ext + uVar6 * 2 + 1) != '\0') {
            uVar7 = 0;
            do {
              lydict_remove(ctx,(char *)(&(*pplVar4)->def)[uVar7]);
              uVar7 = uVar7 + 1;
              pplVar4 = node[1].ext + uVar6 * 2;
            } while (uVar7 < *(byte *)(node[1].ext + uVar6 * 2 + 1));
          }
          free(*pplVar4);
          uVar6 = uVar6 + 1;
        } while (uVar6 < node->padding[3]);
      }
      free(node[1].ext);
      value = node[1].module;
      goto LAB_0015e6e1;
    }
    if (LVar1 == LYS_ANYXML) {
LAB_0015e344:
      if (node->padding[3] != '\0') {
        lVar8 = 0;
        uVar6 = 0;
        do {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar8),private_destructor);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x38;
        } while (uVar6 < node->padding[3]);
      }
      goto LAB_0015e518;
    }
    if (LVar1 != LYS_CASE) goto switchD_0015e03e_caseD_3;
switchD_0015e03e_caseD_2:
    w = *(lys_when **)node->hash;
LAB_0015e525:
    lys_when_free(ctx,w,private_destructor);
  }
switchD_0015e03e_caseD_3:
  lys_node_unlink(node);
  free(node);
  return;
}

Assistant:

void
lys_node_free(struct lys_node *node, void (*private_destructor)(const struct lys_node *node, void *priv), int shallow)
{
    struct ly_ctx *ctx;
    struct lys_node *sub, *next;

    if (!node) {
        return;
    }

    assert(node->module);
    assert(node->module->ctx);

    ctx = node->module->ctx;

    /* remove private object */
    if (node->priv && private_destructor) {
        private_destructor(node, node->priv);
    }

    /* common part */
    lydict_remove(ctx, node->name);
    if (!(node->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
        lys_iffeature_free(ctx, node->iffeature, node->iffeature_size, shallow, private_destructor);
        lydict_remove(ctx, node->dsc);
        lydict_remove(ctx, node->ref);
    }

    if (!shallow && !(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LY_TREE_FOR_SAFE(node->child, next, sub) {
            lys_node_free(sub, private_destructor, 0);
        }
    }

    lys_extension_instances_free(ctx, node->ext, node->ext_size, private_destructor);

    /* specific part */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        lys_container_free(ctx, (struct lys_node_container *)node, private_destructor);
        break;
    case LYS_CHOICE:
        lys_when_free(ctx, ((struct lys_node_choice *)node)->when, private_destructor);
        break;
    case LYS_LEAF:
        lys_leaf_free(ctx, (struct lys_node_leaf *)node, private_destructor);
        break;
    case LYS_LEAFLIST:
        lys_leaflist_free(ctx, (struct lys_node_leaflist *)node, private_destructor);
        break;
    case LYS_LIST:
        lys_list_free(ctx, (struct lys_node_list *)node, private_destructor);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        lys_anydata_free(ctx, (struct lys_node_anydata *)node, private_destructor);
        break;
    case LYS_USES:
        lys_uses_free(ctx, (struct lys_node_uses *)node, private_destructor);
        break;
    case LYS_CASE:
        lys_when_free(ctx, ((struct lys_node_case *)node)->when, private_destructor);
        break;
    case LYS_AUGMENT:
        /* do nothing */
        break;
    case LYS_GROUPING:
        lys_grp_free(ctx, (struct lys_node_grp *)node, private_destructor);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        lys_rpc_action_free(ctx, (struct lys_node_rpc_action *)node, private_destructor);
        break;
    case LYS_NOTIF:
        lys_notif_free(ctx, (struct lys_node_notif *)node, private_destructor);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        lys_inout_free(ctx, (struct lys_node_inout *)node, private_destructor);
        break;
    case LYS_EXT:
    case LYS_UNKNOWN:
        LOGINT(ctx);
        break;
    }

    /* again common part */
    lys_node_unlink(node);
    free(node);
}